

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall leveldb::log::_Test_PartialLastIsIgnored::_Run(_Test_PartialLastIsIgnored *this)

{
  size_t local_598;
  int local_58c;
  Tester local_588;
  undefined1 local_3e8 [448];
  undefined1 local_228 [471];
  allocator local_51;
  string local_50 [32];
  log local_30 [32];
  _Test_PartialLastIsIgnored *local_10;
  _Test_PartialLastIsIgnored *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"bar",&local_51);
  BigString(local_30,(string *)local_50,0x8000);
  LogTest::Write(&this->super_LogTest,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  LogTest::ShrinkSize(&this->super_LogTest,1);
  test::Tester::Tester
            ((Tester *)(local_228 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x1d9);
  LogTest::Read_abi_cxx11_((LogTest *)local_228);
  test::Tester::IsEq<char[4],std::__cxx11::string>
            ((Tester *)(local_228 + 0x20),(char (*) [4])"EOF",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
  std::__cxx11::string::~string((string *)local_228);
  test::Tester::~Tester((Tester *)(local_228 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_3e8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x1da);
  LogTest::ReportMessage_abi_cxx11_((LogTest *)local_3e8);
  test::Tester::IsEq<char[1],std::__cxx11::string>
            ((Tester *)(local_3e8 + 0x20),(char (*) [1])0x11b022,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8);
  std::__cxx11::string::~string((string *)local_3e8);
  test::Tester::~Tester((Tester *)(local_3e8 + 0x20));
  test::Tester::Tester
            (&local_588,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x1db);
  local_58c = 0;
  local_598 = LogTest::DroppedBytes(&this->super_LogTest);
  test::Tester::IsEq<int,unsigned_long>(&local_588,&local_58c,&local_598);
  test::Tester::~Tester(&local_588);
  return;
}

Assistant:

TEST(LogTest, PartialLastIsIgnored) {
  Write(BigString("bar", kBlockSize));
  // Cause a bad record length in the LAST block.
  ShrinkSize(1);
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ("", ReportMessage());
  ASSERT_EQ(0, DroppedBytes());
}